

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::FboDepthTests::init(FboDepthTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  BasicFboDepthCase *this_00;
  char *pcVar4;
  DepthWriteClampCase *this_01;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  DepthTestClampCase *this_02;
  undefined8 extraout_RAX_00;
  long lVar6;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic depth tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    this_00 = (BasicFboDepthCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar4 = FboTestUtil::getFormatName(dVar1);
    BasicFboDepthCase::BasicFboDepthCase
              (this_00,pCVar2,pcVar4,glcts::fixed_sample_locations_values + 1,dVar1,0x77,0x7f);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_write_clamp","Depth write clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    this_01 = (DepthWriteClampCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar4 = FboTestUtil::getFormatName(dVar1);
    DepthWriteClampCase::DepthWriteClampCase
              (this_01,pCVar2,pcVar4,glcts::fixed_sample_locations_values + 1,dVar1,0x77,0x7f);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_test_clamp","Depth test value clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  uVar5 = extraout_RAX;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    this_02 = (DepthTestClampCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar4 = FboTestUtil::getFormatName(dVar1);
    DepthTestClampCase::DepthTestClampCase
              (this_02,pCVar2,pcVar4,glcts::fixed_sample_locations_values + 1,dVar1,0x77,0x7f);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
    uVar5 = extraout_RAX_00;
  }
  return (int)uVar5;
}

Assistant:

void FboDepthTests::init (void)
{
	static const deUint32 depthFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic depth tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			basicGroup->addChild(new BasicFboDepthCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_write_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_write_clamp", "Depth write clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthWriteClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_test_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_test_clamp", "Depth test value clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthTestClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}
}